

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O2

string * __thiscall
soul::Program::ProgramImpl::getVariableNameWithQualificationIfNeeded_abi_cxx11_
          (string *__return_storage_ptr__,ProgramImpl *this,Module *context,Variable *v)

{
  pointer ppVar1;
  Module *pMVar2;
  bool bVar3;
  string *psVar4;
  pointer ppVar5;
  ArrayView<soul::pool_ref<soul::heart::Variable>_> local_60;
  string local_50;
  
  if ((v->role & ~external) == state) {
    ppVar1 = (this->modules).
             super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar5 = (this->modules).
                  super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1)
    {
      local_60.s = (ppVar5->object->stateVariables).stateVariables.items;
      local_60.e = local_60.s + (ppVar5->object->stateVariables).stateVariables.numActive;
      bVar3 = contains<soul::ArrayView<soul::pool_ref<soul::heart::Variable>>,soul::heart::Variable_const&>
                        (&local_60,v);
      if (bVar3) {
        pMVar2 = ppVar5->object;
        if (pMVar2 != context) {
          psVar4 = Identifier::operator_cast_to_string_(&v->name);
          TokenisedPathString::join(&local_50,&pMVar2->fullName,psVar4);
          stripRootNamespaceFromQualifiedPath(__return_storage_ptr__,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          return __return_storage_ptr__;
        }
        psVar4 = Identifier::toString_abi_cxx11_(&v->name);
        goto LAB_001f8697;
      }
    }
  }
  psVar4 = Identifier::operator_cast_to_string_(&v->name);
LAB_001f8697:
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string getVariableNameWithQualificationIfNeeded (const Module& context, const heart::Variable& v) const
    {
        if (v.isState())
        {
            for (auto& m : modules)
            {
                if (contains (m->stateVariables.get(), v))
                {
                    if (m == context)
                        return v.name.toString();

                    return stripRootNamespaceFromQualifiedPath (TokenisedPathString::join (m->fullName, v.name));
                }
            }
        }

        return v.name;
    }